

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::DisplayFinalEntries(cmComputeLinkDepends *this)

{
  FILE *pFVar1;
  bool bVar2;
  undefined8 uVar3;
  pointer pLVar4;
  __normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
  local_28;
  __normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
  local_20;
  __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
  local_18;
  const_iterator lei;
  cmComputeLinkDepends *this_local;
  
  pFVar1 = _stderr;
  lei._M_current = (LinkEntry *)this;
  cmTarget::GetName_abi_cxx11_(this->Target);
  uVar3 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"target [%s] links to:\n",uVar3);
  local_20._M_current =
       (LinkEntry *)
       std::
       vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
       begin(&this->FinalLinkEntries);
  __gnu_cxx::
  __normal_iterator<cmComputeLinkDepends::LinkEntry_const*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>
  ::__normal_iterator<cmComputeLinkDepends::LinkEntry*>
            ((__normal_iterator<cmComputeLinkDepends::LinkEntry_const*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>
              *)&local_18,&local_20);
  while( true ) {
    local_28._M_current =
         (LinkEntry *)
         std::
         vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
         end(&this->FinalLinkEntries);
    bVar2 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar2) break;
    pLVar4 = __gnu_cxx::
             __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
             ::operator->(&local_18);
    pFVar1 = _stderr;
    if (pLVar4->Target == (cmTarget *)0x0) {
      __gnu_cxx::
      __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
      ::operator->(&local_18);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"  item [%s]\n",uVar3);
    }
    else {
      pLVar4 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
               ::operator->(&local_18);
      cmTarget::GetName_abi_cxx11_(pLVar4->Target);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"  target [%s]\n",uVar3);
    }
    __gnu_cxx::
    __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
    ::operator++(&local_18);
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayFinalEntries()
{
  fprintf(stderr, "target [%s] links to:\n", this->Target->GetName().c_str());
  for(std::vector<LinkEntry>::const_iterator lei =
        this->FinalLinkEntries.begin();
      lei != this->FinalLinkEntries.end(); ++lei)
    {
    if(lei->Target)
      {
      fprintf(stderr, "  target [%s]\n", lei->Target->GetName().c_str());
      }
    else
      {
      fprintf(stderr, "  item [%s]\n", lei->Item.c_str());
      }
    }
  fprintf(stderr, "\n");
}